

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getColsBySet(void *highs,HighsInt num_set_entries,HighsInt *set,HighsInt *num_col,
                           double *costs,double *lower,double *upper,HighsInt *num_nz,
                           HighsInt *matrix_start,HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  undefined4 *in_RCX;
  undefined4 *in_stack_00000010;
  HighsStatus status;
  HighsInt local_num_nz;
  HighsInt local_num_col;
  double *in_stack_000000b8;
  double *in_stack_000000c0;
  HighsInt *in_stack_000000c8;
  HighsInt *in_stack_000000d0;
  HighsInt in_stack_000000dc;
  Highs *in_stack_000000e0;
  double *in_stack_00000100;
  HighsInt *in_stack_00000108;
  HighsInt *in_stack_00000110;
  HighsInt *in_stack_00000118;
  double *in_stack_00000120;
  undefined4 local_48;
  undefined4 local_44;
  
  HVar1 = Highs::getCols(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000c8,
                         in_stack_000000c0,in_stack_000000b8,in_stack_00000100,in_stack_00000108,
                         in_stack_00000110,in_stack_00000118,in_stack_00000120);
  *in_RCX = local_44;
  *in_stack_00000010 = local_48;
  return HVar1;
}

Assistant:

HighsInt Highs_getColsBySet(const void* highs, const HighsInt num_set_entries,
                            const HighsInt* set, HighsInt* num_col,
                            double* costs, double* lower, double* upper,
                            HighsInt* num_nz, HighsInt* matrix_start,
                            HighsInt* matrix_index, double* matrix_value) {
  HighsInt local_num_col, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getCols(num_set_entries, set, local_num_col, costs, lower, upper,
                    local_num_nz, matrix_start, matrix_index, matrix_value);
  *num_col = local_num_col;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}